

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.hpp
# Opt level: O3

bool __thiscall Player::operator==(Player *this,Player *p)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  string *psVar3;
  bool bVar4;
  
  psVar2 = BlackCard::getName_abi_cxx11_(&p->stronghold->super_BlackCard);
  psVar3 = BlackCard::getName_abi_cxx11_(&this->stronghold->super_BlackCard);
  __n = psVar2->_M_string_length;
  if (__n == psVar3->_M_string_length) {
    if (__n == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,(psVar3->_M_dataplus)._M_p,__n);
      bVar4 = iVar1 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator==(const Player &p) const{ return p.stronghold->getName() == stronghold->getName(); }